

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O3

void bng_draw_select(t_bng *x,_glist *glist)

{
  t_iem_fstyle_flags tVar1;
  _glist *in_RAX;
  _glist *p_Var2;
  int iVar3;
  uint uVar4;
  char tag [128];
  char local_b8 [136];
  
  p_Var2 = glist_getcanvas(in_RAX);
  tVar1 = (x->x_gui).x_fsf;
  iVar3 = 0xff;
  if (((uint)tVar1 >> 0x18 & 1) == 0) {
    iVar3 = (x->x_gui).x_lcol;
  }
  sprintf(local_b8,"%lxBASE",x);
  uVar4 = ((int)tVar1 << 7) >> 0x1f & 0xff;
  pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_b8,"-outline",uVar4);
  sprintf(local_b8,"%lxBUT",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_b8,"-outline",uVar4);
  sprintf(local_b8,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_b8,"-fill",iVar3);
  return;
}

Assistant:

static void bng_draw_select(t_bng* x, t_glist* glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    int col = IEM_GUI_COLOR_NORMAL, lcol = x->x_gui.x_lcol;
    char tag[128];

    if(x->x_gui.x_fsf.x_selected)
        col = lcol = IEM_GUI_COLOR_SELECTED;

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-outline", col);
    sprintf(tag, "%lxBUT", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-outline", col);
    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-fill", lcol);
}